

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraintJacobian
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *stateJacobianValues,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *controlJacobianValues)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  DynamicalSystem *this_00;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  uint uVar10;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *pvVar11;
  int iVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ostream *poVar20;
  string *psVar21;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  ulong uVar25;
  pointer pcVar26;
  ulong uVar27;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_228;
  pointer local_208;
  double local_200;
  long local_1f8;
  MatrixDynSize *local_1f0;
  size_t local_1e8;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_1e0;
  undefined1 local_1d8 [16];
  ostringstream local_1c8 [8];
  long local_1c0;
  long lStack_1b8;
  undefined8 local_1b0;
  PointerType local_1a8;
  long lStack_1a0;
  long local_198;
  ios_base local_158 [264];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  this_00 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (DynamicalSystem *)0x0) {
    psVar21 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar26 = (psVar21->_M_dataplus)._M_p;
    pcVar24 = "evaluateCollocationConstraint";
    pcVar23 = "Dynamical system not set.";
LAB_0017dbdf:
    iDynTree::reportError(pcVar26,pcVar24,pcVar23);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        local_1d8._8_4_ = in_XMM1_Dc;
        local_1d8._0_8_ = dT;
        local_1d8._12_4_ = in_XMM1_Dd;
        local_200 = time;
        local_1e0 = controlJacobianValues;
        sVar13 = DynamicalSystem::stateSpaceSize(this_00);
        local_1e8 = DynamicalSystem::controlSpaceSize
                              ((this->super_FixedStepIntegrator).super_Integrator.
                               m_dynamicalSystem_ptr.
                               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        if ((long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x50) {
          std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                    (stateJacobianValues,2);
        }
        uVar14 = iDynTree::MatrixDynSize::rows();
        uVar27 = sVar13 & 0xffffffff;
        if ((uVar14 != uVar27) || (uVar15 = iDynTree::MatrixDynSize::cols(), uVar15 != uVar14)) {
          iDynTree::MatrixDynSize::resize
                    ((ulong)(stateJacobianValues->
                            super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                            )._M_impl.super__Vector_impl_data._M_start,uVar27);
        }
        peVar6 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar12 = (*peVar6->_vptr_DynamicalSystem[3])
                           (peVar6,(controlInputs->
                                   super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar12 == '\0') {
          psVar21 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar26 = (psVar21->_M_dataplus)._M_p;
          pcVar24 = "evaluateCollocationConstraintJacobian";
          pcVar23 = "Error while setting the control input.";
        }
        else {
          peVar6 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar12 = (*peVar6->_vptr_DynamicalSystem[9])
                             (local_200,peVar6,
                              (collocationPoints->
                              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                              )._M_impl.super__Vector_impl_data._M_start,&this->m_stateJacBuffer);
          if ((char)iVar12 == '\0') {
            psVar21 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar26 = (psVar21->_M_dataplus)._M_p;
            pcVar24 = "evaluateCollocationConstraintJacobian";
            pcVar23 = "Error while evaluating the dynamical system jacobian.";
          }
          else {
            lVar16 = iDynTree::MatrixDynSize::data();
            iDynTree::MatrixDynSize::rows();
            local_1f0 = &this->m_identity;
            iDynTree::MatrixDynSize::cols();
            lVar17 = iDynTree::MatrixDynSize::data();
            iDynTree::MatrixDynSize::rows();
            iDynTree::MatrixDynSize::cols();
            local_208 = (stateJacobianValues->
                        super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            uVar15 = iDynTree::MatrixDynSize::data();
            local_1f8 = iDynTree::MatrixDynSize::rows();
            lVar18 = iDynTree::MatrixDynSize::cols();
            uVar19 = lVar18 * local_1f8;
            uVar14 = uVar19;
            if (((uVar15 & 7) == 0) &&
               (uVar14 = (ulong)((uint)(uVar15 >> 3) & 1), (long)uVar19 <= (long)uVar14)) {
              uVar14 = uVar19;
            }
            lVar18 = uVar19 - uVar14;
            if (0 < (long)uVar14) {
              uVar25 = 0;
              do {
                *(double *)(uVar15 + uVar25 * 8) =
                     *(double *)(lVar17 + uVar25 * 8) * (double)local_1d8._0_8_ +
                     *(double *)(lVar16 + uVar25 * 8);
                uVar25 = uVar25 + 1;
              } while (uVar14 != uVar25);
            }
            lVar22 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
            if (1 < lVar18) {
              do {
                pdVar1 = (double *)(lVar16 + uVar14 * 8);
                dVar7 = pdVar1[1];
                pdVar2 = (double *)(lVar17 + uVar14 * 8);
                dVar8 = pdVar2[1];
                pdVar3 = (double *)(uVar15 + uVar14 * 8);
                *pdVar3 = *pdVar2 * (double)local_1d8._0_8_ + *pdVar1;
                pdVar3[1] = dVar8 * (double)local_1d8._0_8_ + dVar7;
                uVar14 = uVar14 + 2;
              } while ((long)uVar14 < lVar22);
            }
            if (lVar22 < (long)uVar19) {
              do {
                *(double *)(uVar15 + lVar22 * 8) =
                     *(double *)(lVar17 + lVar22 * 8) * (double)local_1d8._0_8_ +
                     *(double *)(lVar16 + lVar22 * 8);
                lVar22 = lVar22 + 1;
              } while (uVar19 - lVar22 != 0);
            }
            uVar14 = iDynTree::MatrixDynSize::rows();
            if ((uVar14 != uVar27) || (uVar14 = iDynTree::MatrixDynSize::cols(), uVar14 != uVar27))
            {
              iDynTree::MatrixDynSize::resize
                        ((ulong)((stateJacobianValues->
                                 super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar27);
            }
            lVar16 = iDynTree::MatrixDynSize::data();
            iDynTree::MatrixDynSize::rows();
            iDynTree::MatrixDynSize::cols();
            uVar15 = iDynTree::MatrixDynSize::data();
            lVar17 = iDynTree::MatrixDynSize::rows();
            lVar18 = iDynTree::MatrixDynSize::cols();
            pvVar11 = local_1e0;
            sVar13 = local_1e8;
            uVar19 = lVar18 * lVar17;
            uVar14 = uVar19;
            if (((uVar15 & 7) == 0) &&
               (uVar14 = (ulong)((uint)(uVar15 >> 3) & 1), (long)uVar19 <= (long)uVar14)) {
              uVar14 = uVar19;
            }
            lVar17 = uVar19 - uVar14;
            if (0 < (long)uVar14) {
              uVar25 = 0;
              do {
                *(ulong *)(uVar15 + uVar25 * 8) =
                     *(ulong *)(lVar16 + uVar25 * 8) ^ 0x8000000000000000;
                uVar25 = uVar25 + 1;
              } while (uVar14 != uVar25);
            }
            lVar18 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
            if (1 < lVar17) {
              do {
                puVar4 = (undefined4 *)(lVar16 + uVar14 * 8);
                uVar10 = puVar4[1];
                uVar9 = *(undefined8 *)(puVar4 + 2);
                puVar5 = (undefined4 *)(uVar15 + uVar14 * 8);
                *puVar5 = *puVar4;
                puVar5[1] = uVar10 ^ 0x80000000;
                puVar5[2] = (int)uVar9;
                puVar5[3] = (uint)((ulong)uVar9 >> 0x20) ^ 0x80000000;
                uVar14 = uVar14 + 2;
              } while ((long)uVar14 < lVar18);
            }
            if (lVar18 < (long)uVar19) {
              do {
                *(ulong *)(uVar15 + lVar18 * 8) =
                     *(ulong *)(lVar16 + lVar18 * 8) ^ 0x8000000000000000;
                lVar18 = lVar18 + 1;
              } while (uVar19 - lVar18 != 0);
            }
            if ((long)(local_1e0->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_1e0->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start != 0x50) {
              std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                        (local_1e0,2);
            }
            uVar14 = iDynTree::MatrixDynSize::rows();
            if ((uVar14 != uVar27) ||
               (uVar14 = iDynTree::MatrixDynSize::cols(), uVar14 != (sVar13 & 0xffffffff))) {
              iDynTree::MatrixDynSize::resize
                        ((ulong)(pvVar11->
                                super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                )._M_impl.super__Vector_impl_data._M_start,uVar27);
            }
            peVar6 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar12 = (*peVar6->_vptr_DynamicalSystem[10])
                               (local_200,peVar6,
                                (collocationPoints->
                                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                )._M_impl.super__Vector_impl_data._M_start,&this->m_controlJacBuffer
                               );
            if ((char)iVar12 != '\0') {
              toEigen(&local_228,&this->m_controlJacBuffer);
              local_1c0 = local_228.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_rows.m_value;
              lStack_1b8 = local_228.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_cols.m_value;
              local_1b0 = local_1d8._0_8_;
              local_1a8 = local_228.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_1a0 = local_228.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              local_198 = local_228.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value;
              toEigen(&local_50,
                      (pvVar11->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start);
              Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
                        ((Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>> *)&local_50,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                          *)local_1c8);
              uVar14 = iDynTree::MatrixDynSize::rows();
              if ((uVar14 != uVar27) ||
                 (uVar14 = iDynTree::MatrixDynSize::cols(), uVar14 != (sVar13 & 0xffffffff))) {
                iDynTree::MatrixDynSize::resize
                          ((ulong)((pvVar11->
                                   super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar27);
              }
              iDynTree::MatrixDynSize::operator=
                        ((pvVar11->
                         super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                         )._M_impl.super__Vector_impl_data._M_start + 0x28,&this->m_zeroNxNuBuffer);
              return true;
            }
            psVar21 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar26 = (psVar21->_M_dataplus)._M_p;
            pcVar24 = "evaluateCollocationConstraintJacobian";
            pcVar23 = "Error while evaluating the dynamical system control jacobian.";
          }
        }
        goto LAB_0017dbdf;
      }
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "The size of the matrix containing the control inputs does not match the expected one. Input = "
                 ,0x5e);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", Expected = 2.",0xf);
      psVar21 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar23 = (psVar21->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar23,"evaluateCollocationConstraintJacobian",
                 (char *)local_228.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "The size of the matrix containing the collocation point does not match the expected one. Input = "
                 ,0x61);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", Expected = 2.",0xf);
      psVar21 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar23 = (psVar21->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar23,"evaluateCollocationConstraintJacobian",
                 (char *)local_228.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    if ((variable_if_dynamic<long,__1> *)
        local_228.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data !=
        &local_228.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols) {
      operator_delete(local_228.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data,local_228.
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_cols.m_value + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
    std::ios_base::~ios_base(local_158);
  }
  return false;
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraintJacobian(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                     const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                     std::vector<MatrixDynSize> &stateJacobianValues,
                                                                     std::vector<MatrixDynSize> &controlJacobianValues)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                if (stateJacobianValues.size() != 2) {
                    stateJacobianValues.resize(2);
                }

                if ((stateJacobianValues[0].rows() != nx) || (stateJacobianValues[0].cols() != nx)) {
                    stateJacobianValues[0].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[0], time, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[0]) = toEigen(m_identity) + dT*toEigen(m_stateJacBuffer);

                if ((stateJacobianValues[1].rows() != nx) || (stateJacobianValues[1].cols() != nx)) {
                    stateJacobianValues[1].resize(nx,nx);
                }

                toEigen(stateJacobianValues[1]) = -toEigen(m_identity);

                //Control Jacobians

                if (controlJacobianValues.size() != 2) {
                    controlJacobianValues.resize(2);
                }

                if ((controlJacobianValues[0].rows() != nx) || (controlJacobianValues[0].cols() != nu)) {
                    controlJacobianValues[0].resize(nx,nu);
                }

                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[0], time, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[0]) = dT*toEigen(m_controlJacBuffer);

                if ((controlJacobianValues[1].rows() != nx) || (controlJacobianValues[1].cols() != nu)) {
                    controlJacobianValues[1].resize(nx,nu);
                }

                controlJacobianValues[1] = m_zeroNxNuBuffer;

                return true;
            }